

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O2

Signedness __thiscall
spvtools::opt::anon_unknown_15::IsGreaterThanZero::VisitExpr
          (IsGreaterThanZero *this,SENode *node,
          function<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness)>
          *reduce)

{
  pointer ppSVar1;
  Signedness __args;
  Signedness SVar2;
  pointer ppSVar3;
  
  __args = Visit(this,*(node->children_).
                       super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  ppSVar3 = (node->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (node->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (; (ppSVar3 = ppSVar3 + 1, ppSVar3 != ppSVar1 && (__args != kPositiveOrNegative));
      __args = std::
               function<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness)>
               ::operator()(reduce,__args,SVar2)) {
    SVar2 = Visit(this,*ppSVar3);
  }
  SVar2 = kPositiveOrNegative;
  if (ppSVar3 == ppSVar1) {
    SVar2 = __args;
  }
  return SVar2;
}

Assistant:

Signedness VisitExpr(
      const SENode* node,
      std::function<Signedness(Signedness, Signedness)> reduce) {
    Signedness result = Visit(*node->begin());
    for (const SENode* operand : make_range(++node->begin(), node->end())) {
      if (result == Signedness::kPositiveOrNegative) {
        return Signedness::kPositiveOrNegative;
      }
      result = reduce(result, Visit(operand));
    }
    return result;
  }